

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O2

int publickey_packet_receive(LIBSSH2_PUBLICKEY *pkey,uchar **data,size_t *data_len)

{
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *session;
  uint32_t uVar1;
  int iVar2;
  size_t sVar3;
  ssize_t sVar4;
  uchar *buf;
  char *errmsg;
  uchar buffer [4];
  
  channel = pkey->channel;
  session = channel->session;
  *data = (uchar *)0x0;
  *data_len = 0;
  if (pkey->receive_state == libssh2_NB_state_idle) {
    sVar4 = _libssh2_channel_read(channel,0,(char *)buffer,4);
    if (sVar4 == -0x25) {
      return -0x25;
    }
    if (sVar4 == 4) {
      uVar1 = _libssh2_ntohu32(buffer);
      pkey->receive_packet_len = (ulong)uVar1;
      buf = (uchar *)(*session->alloc)((ulong)uVar1,&session->abstract);
      pkey->receive_packet = buf;
      if (buf != (uchar *)0x0) {
        pkey->receive_state = libssh2_NB_state_sent;
        goto LAB_0011f4cb;
      }
      errmsg = "Unable to allocate publickey response buffer";
      iVar2 = -6;
    }
    else {
      errmsg = "Invalid response from publickey subsystem";
      iVar2 = -0x24;
    }
LAB_0011f57d:
    iVar2 = _libssh2_error(session,iVar2,errmsg);
  }
  else {
    if (pkey->receive_state == libssh2_NB_state_sent) {
      buf = pkey->receive_packet;
LAB_0011f4cb:
      sVar3 = _libssh2_channel_read(channel,0,(char *)buf,pkey->receive_packet_len);
      if (sVar3 == 0xffffffffffffffdb) {
        return -0x25;
      }
      if (sVar3 != pkey->receive_packet_len) {
        (*session->free)(pkey->receive_packet,&session->abstract);
        pkey->receive_packet = (uchar *)0x0;
        pkey->receive_state = libssh2_NB_state_idle;
        errmsg = "Timeout waiting for publickey subsystem response packet";
        iVar2 = -0x1e;
        goto LAB_0011f57d;
      }
      *data = pkey->receive_packet;
      *data_len = sVar3;
    }
    pkey->receive_state = libssh2_NB_state_idle;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
publickey_packet_receive(LIBSSH2_PUBLICKEY * pkey,
                         unsigned char **data, size_t *data_len)
{
    LIBSSH2_CHANNEL *channel = pkey->channel;
    LIBSSH2_SESSION *session = channel->session;
    unsigned char buffer[4];
    ssize_t rc;
    *data = NULL; /* default to nothing returned */
    *data_len = 0;

    if(pkey->receive_state == libssh2_NB_state_idle) {
        rc = _libssh2_channel_read(channel, 0, (char *) buffer, 4);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return (int)rc;
        }
        else if(rc != 4) {
            return _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                                  "Invalid response from publickey subsystem");
        }

        pkey->receive_packet_len = _libssh2_ntohu32(buffer);
        pkey->receive_packet =
            LIBSSH2_ALLOC(session, pkey->receive_packet_len);
        if(!pkey->receive_packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate publickey response "
                                  "buffer");
        }

        pkey->receive_state = libssh2_NB_state_sent;
    }

    if(pkey->receive_state == libssh2_NB_state_sent) {
        rc = _libssh2_channel_read(channel, 0, (char *) pkey->receive_packet,
                                   pkey->receive_packet_len);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return (int)rc;
        }
        else if(rc != (ssize_t)pkey->receive_packet_len) {
            LIBSSH2_FREE(session, pkey->receive_packet);
            pkey->receive_packet = NULL;
            pkey->receive_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_TIMEOUT,
                                  "Timeout waiting for publickey subsystem "
                                  "response packet");
        }

        *data = pkey->receive_packet;
        *data_len = pkey->receive_packet_len;
    }

    pkey->receive_state = libssh2_NB_state_idle;

    return 0;
}